

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_2,_3> * __thiscall
gl4cts::Math::outerProduct<3,2>
          (Matrix<double,_2,_3> *__return_storage_ptr__,Math *this,Vector<double,_2> *left,
          Vector<double,_3> *right)

{
  double dVar1;
  undefined1 auVar2 [16];
  Matrix<double,_2,_3> *result;
  long lVar3;
  Matrix<double,_2,_3> *pMVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  double local_58 [4];
  undefined1 auStack_38 [8];
  Matrix<double,_2,_3> res;
  long lVar9;
  
  auVar2 = _DAT_019f5ce0;
  lVar3 = 0;
  auVar13 = _DAT_019fcc00;
  do {
    bVar7 = SUB164(auVar13 ^ _DAT_019f5ce0,4) == -0x80000000 &&
            SUB164(auVar13 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
    if (bVar7) {
      dVar10 = 1.0;
      if (lVar3 != 0) {
        dVar10 = 0.0;
      }
      local_58[lVar3] = dVar10;
    }
    if (bVar7) {
      local_58[lVar3 + 1] = 0.0;
    }
    lVar3 = lVar3 + 2;
    lVar6 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 2;
    auVar13._8_8_ = lVar6 + 2;
  } while (lVar3 != 4);
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data).m_data[2].m_data = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data).m_data[1].m_data = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data).m_data[0].m_data = (undefined1  [16])0x0;
  auVar13 = _DAT_019fcc00;
  lVar3 = 0;
  bVar7 = true;
  do {
    bVar5 = bVar7;
    lVar6 = 0;
    auVar8 = auVar13;
    do {
      auVar11 = auVar8 ^ auVar2;
      bVar7 = auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7ffffffd;
      if (bVar7) {
        uVar12 = 0x3ff0000000000000;
        if (lVar3 * 0x10 != lVar6) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar6 + lVar3 * 8)
             = uVar12;
      }
      if (bVar7) {
        uVar12 = 0x3ff0000000000000;
        if (lVar3 * 0x10 + -0x10 != lVar6) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)(__return_storage_ptr__->m_data).m_data[1].m_data + lVar6 + lVar3 * 8)
             = uVar12;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x40);
    lVar3 = 1;
    bVar7 = false;
  } while (bVar5);
  dVar10 = *(double *)this;
  dVar1 = *(double *)(this + 8);
  local_58[2] = left[1].m_data[0];
  local_58[0] = left->m_data[0];
  local_58[1] = left->m_data[1];
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  auStack_38 = (undefined1  [8])0x0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  lVar3 = 0;
  pMVar4 = (Matrix<double,_2,_3> *)auStack_38;
  bVar7 = true;
  do {
    bVar5 = bVar7;
    lVar6 = 0;
    auVar11 = _DAT_019fcc00;
    do {
      auVar13 = auVar11 ^ auVar2;
      bVar7 = auVar13._4_4_ == -0x80000000 && auVar13._0_4_ < -0x7ffffffd;
      if (bVar7) {
        uVar12 = 0x3ff0000000000000;
        if (lVar3 * 0x10 != lVar6) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)(pMVar4->m_data).m_data[0].m_data + lVar6) = uVar12;
      }
      if (bVar7) {
        uVar12 = 0x3ff0000000000000;
        if (lVar3 * 0x10 + -0x10 != lVar6) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)(pMVar4->m_data).m_data[1].m_data + lVar6) = uVar12;
      }
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar9 + 2;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x40);
    lVar3 = 1;
    pMVar4 = &res;
    bVar7 = false;
  } while (bVar5);
  pMVar4 = (Matrix<double,_2,_3> *)auStack_38;
  bVar7 = true;
  do {
    bVar5 = bVar7;
    lVar3 = 0;
    do {
      *(double *)((long)(pMVar4->m_data).m_data[0].m_data + lVar3 * 2) =
           *(double *)((long)local_58 + lVar3) * dVar10 + 0.0;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    pMVar4 = &res;
    dVar10 = dVar1;
    bVar7 = false;
  } while (bVar5);
  lVar3 = 0;
  pMVar4 = (Matrix<double,_2,_3> *)auStack_38;
  bVar7 = true;
  do {
    bVar5 = bVar7;
    lVar6 = 0;
    do {
      *(undefined8 *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar6 + lVar3 * 8) =
           *(undefined8 *)((long)(pMVar4->m_data).m_data[0].m_data + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    lVar3 = 1;
    pMVar4 = &res;
    bVar7 = false;
  } while (bVar5);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}